

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

ostream * tcu::operator<<(ostream *str,TextureFormat format)

{
  ostream *poVar1;
  ostream *str_local;
  TextureFormat format_local;
  
  str_local._0_4_ = format.order;
  poVar1 = operator<<(str,(ChannelOrder)str_local);
  poVar1 = std::operator<<(poVar1,", ");
  str_local._4_4_ = format.type;
  poVar1 = operator<<(poVar1,str_local._4_4_);
  poVar1 = std::operator<<(poVar1,"");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat format)
{
	return str << format.order << ", " << format.type << "";
}